

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall ConfidentialTxOut_Setter_Test::TestBody(ConfidentialTxOut_Setter_Test *this)

{
  ConfidentialAssetId *object;
  ConfidentialValue *object_00;
  ConfidentialNonce *object_01;
  ByteData *__x;
  ByteData *__x_00;
  undefined8 uVar1;
  _func_int **pp_Var2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_23;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&txout);
  object = &txout.asset_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&txout_ref,object);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialAssetId *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetAsset().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  object_00 = &txout.confidential_value_;
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&txout_ref,object_00);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialValue *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetConfidentialValue().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xca,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&txout_ref,&txout.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_29,(Script *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::Script::~Script((Script *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  object_01 = &txout.nonce_;
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&txout_ref,object_01);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialNonce *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetNonce().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  __x = &txout.range_proof_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar_29);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  __x_00 = &txout.surjection_proof_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29,&__x_00->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar_29);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AVar4 = cfd::core::AbstractTxOut::GetValue(&txout.super_AbstractTxOut);
  gtest_ar_29._0_8_ = AVar4.amount_;
  gtest_ar_29.message_.ptr_._0_1_ = AVar4.ignore_check_;
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_29);
  gtest_ar_16._0_8_ = (ulong)(uint)gtest_ar_16._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&txout_ref,"txout.GetValue().GetSatoshiValue()","0",(long *)&gtest_ar,
             (int *)&gtest_ar_16);
  if ((char)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference == '\0') {
    testing::Message::Message((Message *)&gtest_ar_29);
    if ((undefined8 *)
        CONCAT71(txout_ref.super_AbstractTxOutReference.value_.amount_._1_7_,
                 (undefined1)txout_ref.super_AbstractTxOutReference.value_.amount_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(txout_ref.super_AbstractTxOutReference.value_.amount_._1_7_,
                                  (undefined1)txout_ref.super_AbstractTxOutReference.value_.amount_)
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txout_ref.super_AbstractTxOutReference.value_);
  cfd::core::ConfidentialTxOut::GetWitnessHash((ByteData256 *)&gtest_ar_29,&txout);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData256 *)&gtest_ar_29);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetWitnessHash().GetHex().c_str()",
             "\"7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5\"",
             (char *)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference,
             "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)AVar4.amount_;
  txout_ref.super_AbstractTxOutReference.value_.amount_._0_1_ = AVar4.ignore_check_;
  cfd::core::ConfidentialTxOut::SetValue(&txout,(Amount *)&txout_ref);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&txout_ref,object);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialAssetId *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetAsset().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&txout_ref,object_00);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialValue *)&txout_ref);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetConfidentialValue().GetHex().c_str()",
             "\"010000000005f5e100\"",(char *)gtest_ar_29._0_8_,"010000000005f5e100");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&txout_ref,&txout.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_29,(Script *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::Script::~Script((Script *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&txout_ref,object_01);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialNonce *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetNonce().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar_29);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29,&__x_00->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar_29);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AVar4 = cfd::core::AbstractTxOut::GetValue(&txout.super_AbstractTxOut);
  gtest_ar_29._0_8_ = AVar4.amount_;
  gtest_ar_29.message_.ptr_._0_1_ = AVar4.ignore_check_;
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_29);
  gtest_ar_16._0_4_ = 100000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&txout_ref,"txout.GetValue().GetSatoshiValue()","100000000",
             (long *)&gtest_ar,(int *)&gtest_ar_16);
  if ((char)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference == '\0') {
    testing::Message::Message((Message *)&gtest_ar_29);
    if ((undefined8 *)
        CONCAT71(txout_ref.super_AbstractTxOutReference.value_.amount_._1_7_,
                 (undefined1)txout_ref.super_AbstractTxOutReference.value_.amount_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(txout_ref.super_AbstractTxOutReference.value_.amount_._1_7_,
                                  (undefined1)txout_ref.super_AbstractTxOutReference.value_.amount_)
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txout_ref.super_AbstractTxOutReference.value_);
  cfd::core::ConfidentialTxOut::SetCommitment
            (&txout,&exp_asset,&exp_value,&exp_nonce,&exp_surjection_proof,&exp_range_proof);
  cfd::core::ConfidentialTxOut::GetWitnessHash((ByteData256 *)&gtest_ar_29,&txout);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData256 *)&gtest_ar_29);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetWitnessHash().GetHex().c_str()",
             "\"51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093\"",
             (char *)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference,
             "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_29);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&txout_ref,object);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialAssetId *)&txout_ref);
  uVar1 = gtest_ar_29._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_16,"txout.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txout_ref);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar_16.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&txout_ref,object_00);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialValue *)&txout_ref);
  uVar1 = gtest_ar_29._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_16,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&txout_ref);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar_16.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&txout_ref,&txout.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_29,(Script *)&txout_ref);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)gtest_ar_29._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::Script::~Script((Script *)&txout_ref);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&txout_ref,object_01);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)&gtest_ar_29,(ConfidentialNonce *)&txout_ref);
  uVar1 = gtest_ar_29._0_8_;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_16,"txout.GetNonce().GetHex().c_str()",
             "exp_nonce.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&txout_ref);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar_16.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar);
  pp_Var2 = txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_29,&exp_range_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_16,"txout.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)pp_Var2,(char *)gtest_ar_29._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar_16.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,&__x_00->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&txout_ref,(ByteData *)&gtest_ar);
  pp_Var2 = txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_29,&exp_surjection_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_16,"txout.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)pp_Var2,(char *)gtest_ar_29._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  std::__cxx11::string::~string((string *)&txout_ref);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&txout_ref);
    if (gtest_ar_16.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29,(Message *)&txout_ref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout_ref);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  AVar4 = cfd::core::AbstractTxOut::GetValue(&txout.super_AbstractTxOut);
  gtest_ar_29._0_8_ = AVar4.amount_;
  gtest_ar_29.message_.ptr_._0_1_ = AVar4.ignore_check_;
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_29);
  gtest_ar_16._0_4_ = 100000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&txout_ref,"txout.GetValue().GetSatoshiValue()","100000000",
             (long *)&gtest_ar,(int *)&gtest_ar_16);
  if ((char)txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference == '\0') {
    testing::Message::Message((Message *)&gtest_ar_29);
    if ((undefined8 *)
        CONCAT71(txout_ref.super_AbstractTxOutReference.value_.amount_._1_7_,
                 (undefined1)txout_ref.super_AbstractTxOutReference.value_.amount_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(txout_ref.super_AbstractTxOutReference.value_.amount_._1_7_,
                                  (undefined1)txout_ref.super_AbstractTxOutReference.value_.amount_)
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txout_ref.super_AbstractTxOutReference.value_);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&txout_ref,&txout);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar_29,&txout_ref.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar,(ConfidentialAssetId *)&gtest_ar_29);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar_16,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_23,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_16._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_29);
  if (gtest_ar_23.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_29);
    if (gtest_ar_23.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_23.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_23.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar_29,&txout_ref.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar,(ConfidentialValue *)&gtest_ar_29);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)&gtest_ar_16,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_23,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_16._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_29);
  if (gtest_ar_23.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_29);
    if (gtest_ar_23.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_23.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_23.message_);
  cfd::core::Script::Script
            ((Script *)&gtest_ar_29,&txout_ref.super_AbstractTxOutReference.locking_script_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar,(Script *)&gtest_ar_29);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_16,"txout_ref.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)gtest_ar._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar_29);
  if (gtest_ar_16.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_29);
    if (gtest_ar_16.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar_16.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_16.message_);
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)&gtest_ar_29,&txout_ref.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)&gtest_ar,(ConfidentialNonce *)&gtest_ar_29);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_((string *)&gtest_ar_16,&exp_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_23,"txout_ref.GetNonce().GetHex().c_str()",
             "exp_nonce.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_16._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_16);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&gtest_ar_29);
  if (gtest_ar_23.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_29);
    if (gtest_ar_23.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_23.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_23.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_16,
             &txout_ref.range_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_29,(ByteData *)&gtest_ar_16);
  uVar1 = gtest_ar_29._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_range_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_23,"txout_ref.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_16);
  if (gtest_ar_23.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_29);
    if (gtest_ar_23.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_23.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_23.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_16,
             &txout_ref.surjection_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_29,(ByteData *)&gtest_ar_16);
  uVar1 = gtest_ar_29._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_surjection_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_23,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_29);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_16);
  if (gtest_ar_23.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_29);
    if (gtest_ar_23.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_23.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_29);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_29);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_23.message_);
  gtest_ar._1_7_ = txout_ref.super_AbstractTxOutReference.value_.amount_._1_7_;
  gtest_ar.success_ = (bool)(undefined1)txout_ref.super_AbstractTxOutReference.value_.amount_;
  gtest_ar.message_.ptr_._0_1_ = txout_ref.super_AbstractTxOutReference.value_.ignore_check_;
  gtest_ar_16._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar);
  gtest_ar_23.success_ = false;
  gtest_ar_23._1_3_ = 0x5f5e1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_29,"txout_ref.GetValue().GetSatoshiValue()","100000000",
             (long *)&gtest_ar_16,(int *)&gtest_ar_23);
  if (gtest_ar_29.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT71(gtest_ar_29.message_.ptr_._1_7_,gtest_ar_29.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar_29.message_.ptr_._1_7_,gtest_ar_29.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xfa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_29.message_);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout_ref);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Setter) {
  ConfidentialTxOut txout;

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  txout.SetValue(Amount::CreateBySatoshiAmount(100000000));

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
      "010000000005f5e100");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  txout.SetCommitment(exp_asset, exp_value, exp_nonce, exp_surjection_proof,
                      exp_range_proof);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 100000000);
}